

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.cpp
# Opt level: O1

bool __thiscall ConfusableMatcher::MatchWordBoundaryToRight(ConfusableMatcher *this,CMStringView In)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  int Size;
  
  uVar4 = In._M_len;
  if (4 < uVar4) {
    __assert_fail("In.size() < 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/ConfusableMatcher.cpp"
                  ,0x159,"bool ConfusableMatcher::MatchWordBoundaryToRight(CMStringView)");
  }
  if (uVar4 == 0) {
    bVar2 = false;
  }
  else {
    Size = 1;
    do {
      uVar4 = uVar4 - 1;
      uVar3 = (uint)uVar4;
      bVar2 = (int)uVar3 >= 0;
      if ((int)uVar3 < 0) {
        return bVar2;
      }
      iVar1 = MatchWordBoundary(this,(uchar *)(In._M_str + (uVar3 & 0x7fffffff)),Size);
      Size = Size + 1;
    } while (iVar1 != 1);
  }
  return bVar2;
}

Assistant:

bool ConfusableMatcher::MatchWordBoundaryToRight(CMStringView In)
{
	/*
	 * When searching from left to right, it needs to check everything at most four times as it, for example,
	 * can decode 3 char length codepoint without a match and then find a match at fourth position
	 * 
	 * aaabMATCH
	 *    ^ word boundary
	 * ^^^ decodable char
	 */
	assert(In.size() < 5);
	
	if (In.size() == 0)
		return false;

	/*
	 * Look for chars that were decoded exactly to In.size() - x, we want to avoid scenarios where
	 * char is decodable and is a word boundary char, but does not touch the match.
	 * 
	 * Start looking at characters nearest to the match because... it seems right that way
	 */
	for (int x = In.size() - 1;x >= 0;x--) {
		int res = MatchWordBoundary((const unsigned char*)In.data() + x, In.size() - x);
		if (res == 1)
			return true;
	}

	return false;

}